

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O1

vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> *
rcg::System::getSystems(void)

{
  pointer __s2;
  size_t sVar1;
  size_t __n;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  char *pcVar5;
  System *this;
  GenTLException *this_00;
  ulong uVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  long lVar7;
  pointer pbVar8;
  vector<std::shared_ptr<rcg::System>,std::allocator<std::shared_ptr<rcg::System>>> *in_RDI;
  long *plVar9;
  ulong uVar10;
  bool bVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name;
  ostringstream info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  string local_1e8;
  undefined1 *local_1c8;
  size_t local_1c0;
  undefined1 local_1b8 [16];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::system_mtx);
  if (iVar4 == 0) {
    *(undefined8 *)in_RDI = 0;
    *(undefined8 *)(in_RDI + 8) = 0;
    *(undefined8 *)(in_RDI + 0x10) = 0;
    pcVar5 = extraout_RDX;
    if (DAT_001386b0 == 0) {
      pcVar5 = getenv("GENICAM_GENTL64_PATH");
      setSystemsPath(pcVar5,(char *)0x0);
      pcVar5 = extraout_RDX_00;
    }
    getAvailableGenTLs_abi_cxx11_(&local_200,(anonymous_namespace)::system_path_abi_cxx11_,pcVar5);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    if (local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar10 = 0;
      do {
        pbVar8 = local_200.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar10;
        uVar6 = 0xffffffff;
        if (DAT_00138698 - (long)(anonymous_namespace)::system_list != 0) {
          lVar7 = DAT_00138698 - (long)(anonymous_namespace)::system_list >> 4;
          __s2 = (pbVar8->_M_dataplus)._M_p;
          sVar1 = pbVar8->_M_string_length;
          uVar6 = 0;
          plVar9 = (anonymous_namespace)::system_list;
          do {
            __n = *(size_t *)(*plVar9 + 0x18);
            if ((__n == sVar1) &&
               ((__n == 0 || (iVar4 = bcmp(*(void **)(*plVar9 + 0x10),__s2,__n), iVar4 == 0)))) {
              uVar6 = uVar6 & 0xffffffff;
              goto LAB_0010d423;
            }
            uVar6 = uVar6 + 1;
            plVar9 = plVar9 + 2;
          } while (lVar7 + (ulong)(lVar7 == 0) != uVar6);
          uVar6 = 0xffffffff;
        }
LAB_0010d423:
        uVar3 = DAT_001386d0;
        if (DAT_001386d0 == 0) {
LAB_0010d4cb:
          if ((int)uVar6 < 0) {
            this = (System *)operator_new(0xb0);
            System(this,local_200.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar10);
            std::__shared_ptr<rcg::System,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<rcg::System,void>
                      ((__shared_ptr<rcg::System,(__gnu_cxx::_Lock_policy)2> *)&local_1e8,this);
            std::vector<std::shared_ptr<rcg::System>,std::allocator<std::shared_ptr<rcg::System>>>::
            emplace_back<std::shared_ptr<rcg::System>>(in_RDI,(shared_ptr<rcg::System> *)&local_1e8)
            ;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length)
              ;
            }
          }
          else {
            std::
            vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
            push_back((vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                       *)in_RDI,(value_type *)((anonymous_namespace)::system_list + uVar6 * 2));
          }
        }
        else {
          uVar2 = pbVar8->_M_string_length;
          if (uVar2 < DAT_001386d0) {
            bVar11 = false;
          }
          else {
            std::__cxx11::string::substr((ulong)&local_1c8,(ulong)pbVar8);
            if (local_1c0 == DAT_001386d0) {
              if (local_1c0 == 0) {
                bVar11 = true;
              }
              else {
                iVar4 = bcmp(local_1c8,(anonymous_namespace)::system_ignore_abi_cxx11_,local_1c0);
                bVar11 = iVar4 == 0;
              }
            }
            else {
              bVar11 = false;
            }
          }
          if ((uVar3 <= uVar2) && (local_1c8 != local_1b8)) {
            operator_delete(local_1c8);
          }
          if (!bVar11) goto LAB_0010d4cb;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)((long)local_200.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_200.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
    operator=((vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
               *)&(anonymous_namespace)::system_list,
              (vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
               *)in_RDI);
    if (*(long *)(in_RDI + 8) != *(long *)in_RDI) {
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_200);
      pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::system_mtx);
      return (vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> *
             )in_RDI;
    }
  }
  else {
    std::__throw_system_error(iVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"No transport layers found in path: ",0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(char *)(anonymous_namespace)::system_path_abi_cxx11_,DAT_001386b0
            );
  this_00 = (GenTLException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  GenTLException::GenTLException(this_00,&local_1e8);
  __cxa_throw(this_00,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

std::vector<std::shared_ptr<System> > System::getSystems()
{
  std::lock_guard<std::recursive_mutex> lock(system_mtx);
  std::vector<std::shared_ptr<System> > ret;

  // ensure that system_path is defined

  if (system_path.size() == 0)
  {
    const char *env=0;
    if (sizeof(size_t) == 8)
    {
      env="GENICAM_GENTL64_PATH";
    }
    else
    {
      env="GENICAM_GENTL32_PATH";
    }

    setSystemsPath(std::getenv(env), 0);
  }

  // get list of all available transport layer libraries

  std::vector<std::string> name=getAvailableGenTLs(system_path.c_str());
  std::ostringstream info;

  // create list of systems according to the list, using either existing
  // systems or instantiating new ones

  for (size_t i=0; i<name.size(); i++)
  {
    int k=find(system_list, name[i]);

    if (system_ignore.size() > 0)
    {
      // skipping if name equals ignore

      if (name[i].size() >= system_ignore.size() &&
          name[i].substr(name[i].size()-system_ignore.size()) == system_ignore)
      {
        continue;
      }
    }

    if (k >= 0)
    {
      ret.push_back(system_list[static_cast<size_t>(k)]);
    }
    else
    {
      try
      {
        System *p=new System(name[i]);
        ret.push_back(std::shared_ptr<System>(p));
      }
      catch (const std::exception &ex)
      {
        // ignore transport layers that cannot be used, but collect reason
        // for failure

        info << ex.what() << std::endl;
      }
    }
  }

  // remember returned list for reusing existing systems on the next call

  system_list=ret;

  // throw exception if no transport layers are available

  if (ret.size() == 0)
  {
    info << "No transport layers found in path: " << system_path;
    throw GenTLException(info.str());
  }

  return ret;
}